

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  string *psVar5;
  ulong uVar6;
  iterator iVar7;
  iterator iVar8;
  reference pbVar9;
  ostream *poVar10;
  char *pcVar11;
  bool local_1583;
  bool local_1569;
  string local_1538 [32];
  undefined1 local_1518 [8];
  ostringstream cmCTestLog_msg_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1340;
  undefined1 local_1320 [8];
  string outputFile_1;
  string local_12f8;
  string local_12d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b8;
  allocator<char> local_1291;
  string local_1290;
  string local_1270;
  allocator<char> local_1249;
  string local_1248;
  string local_1228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1208;
  allocator<char> local_11e1;
  string local_11e0;
  string local_11c0;
  undefined1 local_11a0 [8];
  string suppressionsOption;
  string extraOptions;
  string envVar;
  undefined1 local_1120 [8];
  string dpbdFile;
  string outputFile;
  string local_10d8;
  string local_10b8;
  string local_1098 [39];
  allocator<char> local_1071;
  string local_1070;
  string local_1050;
  undefined1 local_1030 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_eb1;
  string local_eb0;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  string local_e48;
  undefined1 local_e28 [8];
  string drMemoryCacheDir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_de8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_de0;
  const_iterator local_dd8;
  const_iterator local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dc8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_dc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  logdirLocation;
  string drMemoryLogDir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  logdirOption;
  undefined1 local_d58 [8];
  string tempDrMemoryDir;
  allocator<char> local_d11;
  string local_d10;
  string local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  int local_cac;
  string local_ca8 [39];
  allocator<char> local_c81;
  string local_c80;
  string local_c60;
  undefined1 local_c40 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_ac1;
  string local_ac0;
  string local_aa0;
  allocator<char> local_a79;
  string local_a78;
  string local_a58;
  string local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9f8;
  allocator<char> local_9d9;
  string local_9d8;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  string local_970;
  allocator<char> local_949;
  string local_948;
  string local_928;
  allocator<char> local_901;
  string local_900;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  string local_898;
  allocator<char> local_871;
  string local_870;
  string local_850;
  allocator<char> local_829;
  string local_828;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  string local_7c0;
  undefined1 local_7a0 [8];
  string memoryTesterOptions;
  ostringstream local_760 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_5e1;
  string local_5e0;
  undefined1 local_5c0 [8];
  string checkType;
  string local_598;
  string local_578;
  allocator<char> local_551;
  string local_550;
  string local_530;
  allocator<char> local_509;
  string local_508;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  string local_458;
  allocator<char> local_431;
  string local_430;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  string local_380;
  allocator<char> local_359;
  string local_358;
  string local_338;
  allocator<char> local_311;
  string local_310;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  byte local_164;
  byte local_163;
  byte local_162;
  allocator<char> local_161;
  string local_160;
  string local_140;
  byte local_11c;
  byte local_11b;
  byte local_11a;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  string testerName;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  string local_38;
  cmCTestMemCheckHandler *local_18;
  cmCTestMemCheckHandler *this_local;
  
  local_18 = this;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"MemoryCheckCommand",&local_59);
  cmCTest::GetCTestConfiguration(&local_38,pcVar1,&local_58);
  bVar2 = cmsys::SystemTools::FileExists(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"MemoryCheckCommand",
               (allocator<char> *)(testerName.field_2._M_local_buf + 0xf));
    cmCTest::GetCTestConfiguration(&local_90,pcVar1,&local_b0);
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)(testerName.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::GetFilenameName((string *)local_d8,&this->MemoryTester);
    lVar4 = std::__cxx11::string::find(local_d8,0x11087b0);
    local_11a = 0;
    local_11b = 0;
    local_11c = 0;
    local_1569 = true;
    if (lVar4 == -1) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      local_11a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"MemoryCheckType",&local_119);
      local_11b = 1;
      cmCTest::GetCTestConfiguration(&local_f8,pcVar1,&local_118);
      local_11c = 1;
      local_1569 = std::operator==(&local_f8,"Valgrind");
    }
    if ((local_11c & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f8);
    }
    if ((local_11b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if ((local_11a & 1) != 0) {
      std::allocator<char>::~allocator(&local_119);
    }
    if (local_1569 == false) {
      lVar4 = std::__cxx11::string::find(local_d8,0x11087c9);
      local_162 = 0;
      local_163 = 0;
      local_164 = 0;
      local_1583 = true;
      if (lVar4 == -1) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        local_162 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"MemoryCheckType",&local_161);
        local_163 = 1;
        cmCTest::GetCTestConfiguration(&local_140,pcVar1,&local_160);
        local_164 = 1;
        local_1583 = std::operator==(&local_140,"DrMemory");
      }
      if ((local_164 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_140);
      }
      if ((local_163 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_160);
      }
      if ((local_162 & 1) != 0) {
        std::allocator<char>::~allocator(&local_161);
      }
      if (local_1583 == false) {
        lVar4 = std::__cxx11::string::find(local_d8,0x11087d2);
        if (lVar4 == -1) {
          lVar4 = std::__cxx11::string::find(local_d8,0x11087d9);
          if (lVar4 == -1) {
            lVar4 = std::__cxx11::string::find(local_d8,0x11087dc);
            if ((lVar4 == -1) &&
               (lVar4 = std::__cxx11::string::find(local_d8,0x11087ea), lVar4 == -1)) {
              this->MemoryTesterStyle = 0;
            }
            else {
              this->MemoryTesterStyle = 5;
            }
          }
          else {
            this->MemoryTesterStyle = 4;
          }
        }
        else {
          this->MemoryTesterStyle = 2;
        }
      }
      else {
        this->MemoryTesterStyle = 3;
      }
    }
    else {
      this->MemoryTesterStyle = 1;
    }
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"PurifyCommand",&local_1a9);
    cmCTest::GetCTestConfiguration(&local_188,pcVar1,&local_1a8);
    bVar2 = cmsys::SystemTools::FileExists(&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    if (bVar2) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"PurifyCommand",&local_1f1);
      cmCTest::GetCTestConfiguration(&local_1d0,pcVar1,&local_1f0);
      std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"ValgrindCommand",&local_239);
      cmCTest::GetCTestConfiguration(&local_218,pcVar1,&local_238);
      bVar2 = cmsys::SystemTools::FileExists(&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
      if (bVar2) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"ValgrindCommand",&local_281);
        cmCTest::GetCTestConfiguration(&local_260,pcVar1,&local_280);
        std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c8,"DrMemoryCommand",&local_2c9);
        cmCTest::GetCTestConfiguration(&local_2a8,pcVar1,&local_2c8);
        bVar2 = cmsys::SystemTools::FileExists(&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::allocator<char>::~allocator(&local_2c9);
        if (bVar2) {
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_310,"DrMemoryCommand",&local_311);
          cmCTest::GetCTestConfiguration(&local_2f0,pcVar1,&local_310);
          std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::allocator<char>::~allocator(&local_311);
          this->MemoryTesterStyle = 3;
        }
        else {
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,"BoundsCheckerCommand",&local_359);
          cmCTest::GetCTestConfiguration(&local_338,pcVar1,&local_358);
          bVar2 = cmsys::SystemTools::FileExists(&local_338);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator(&local_359);
          if (bVar2) {
            pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a0,"BoundsCheckerCommand",&local_3a1);
            cmCTest::GetCTestConfiguration(&local_380,pcVar1,&local_3a0);
            std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_380);
            std::__cxx11::string::~string((string *)&local_380);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::allocator<char>::~allocator(&local_3a1);
            this->MemoryTesterStyle = 4;
          }
          else {
            pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3e8,"CudaSanitizerCommand",&local_3e9);
            cmCTest::GetCTestConfiguration(&local_3c8,pcVar1,&local_3e8);
            bVar2 = cmsys::SystemTools::FileExists(&local_3c8);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_3e8);
            std::allocator<char>::~allocator(&local_3e9);
            if (bVar2) {
              pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_430,"CudaSanitizerCommand",&local_431);
              cmCTest::GetCTestConfiguration(&local_410,pcVar1,&local_430);
              std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_410);
              std::__cxx11::string::~string((string *)&local_410);
              std::__cxx11::string::~string((string *)&local_430);
              std::allocator<char>::~allocator(&local_431);
              this->MemoryTesterStyle = 5;
            }
          }
        }
      }
    }
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"MemoryCheckType",&local_479);
  cmCTest::GetCTestConfiguration(&local_458,pcVar1,&local_478);
  bVar2 = std::operator==(&local_458,"AddressSanitizer");
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  if (bVar2) {
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)psVar5);
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"MemoryCheckType",&local_4c1);
  cmCTest::GetCTestConfiguration(&local_4a0,pcVar1,&local_4c0);
  bVar2 = std::operator==(&local_4a0,"LeakSanitizer");
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  if (bVar2) {
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)psVar5);
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"MemoryCheckType",&local_509);
  cmCTest::GetCTestConfiguration(&local_4e8,pcVar1,&local_508);
  bVar2 = std::operator==(&local_4e8,"ThreadSanitizer");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  if (bVar2) {
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)psVar5);
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"MemoryCheckType",&local_551);
  cmCTest::GetCTestConfiguration(&local_530,pcVar1,&local_550);
  bVar2 = std::operator==(&local_530,"MemorySanitizer");
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  if (bVar2) {
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)psVar5);
    this->MemoryTesterStyle = 9;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"MemoryCheckType",
             (allocator<char> *)(checkType.field_2._M_local_buf + 0xf));
  cmCTest::GetCTestConfiguration(&local_578,pcVar1,&local_598);
  bVar2 = std::operator==(&local_578,"UndefinedBehaviorSanitizer");
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)(checkType.field_2._M_local_buf + 0xf));
  if (bVar2) {
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)psVar5);
    this->MemoryTesterStyle = 10;
    this->LogWithPID = true;
  }
  if (this->MemoryTesterStyle == 0) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"MemoryCheckType",&local_5e1);
    cmCTest::GetCTestConfiguration((string *)local_5c0,pcVar1,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5c0,"Purify");
    if (bVar2) {
      this->MemoryTesterStyle = 2;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_5c0,"BoundsChecker");
      if (bVar2) {
        this->MemoryTesterStyle = 4;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5c0,"Valgrind");
        if (bVar2) {
          this->MemoryTesterStyle = 1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_5c0,"DrMemory");
          if (bVar2) {
            this->MemoryTesterStyle = 3;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_5c0,"CudaSanitizer");
            if (bVar2) {
              this->MemoryTesterStyle = 5;
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_5c0);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_760);
    poVar10 = std::operator<<((ostream *)local_760,
                              "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program."
                             );
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x229,pcVar11,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string((string *)(memoryTesterOptions.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_760);
    this_local._7_1_ = 0;
    goto LAB_002322b3;
  }
  std::__cxx11::string::string((string *)local_7a0);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e0,"MemoryCheckCommandOptions",&local_7e1);
  cmCTest::GetCTestConfiguration(&local_7c0,pcVar1,&local_7e0);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  if (((bVar3 ^ 0xff) & 1) == 0) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"ValgrindCommandOptions",&local_871);
    cmCTest::GetCTestConfiguration(&local_850,pcVar1,&local_870);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_850);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator(&local_871);
    if (((bVar3 ^ 0xff) & 1) == 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_900,"DrMemoryCommandOptions",&local_901);
      cmCTest::GetCTestConfiguration(&local_8e0,pcVar1,&local_900);
      bVar3 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::allocator<char>::~allocator(&local_901);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_990,"CudaSanitizerCommandOptions",&local_991);
        cmCTest::GetCTestConfiguration(&local_970,pcVar1,&local_990);
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_970);
        std::__cxx11::string::~string((string *)&local_990);
        std::allocator<char>::~allocator(&local_991);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9d8,"CudaSanitizerCommandOptions",&local_9d9);
          cmCTest::GetCTestConfiguration(&local_9b8,pcVar1,&local_9d8);
          std::__cxx11::string::operator=((string *)local_7a0,(string *)&local_9b8);
          std::__cxx11::string::~string((string *)&local_9b8);
          std::__cxx11::string::~string((string *)&local_9d8);
          std::allocator<char>::~allocator(&local_9d9);
        }
      }
      else {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_948,"DrMemoryCommandOptions",&local_949);
        cmCTest::GetCTestConfiguration(&local_928,pcVar1,&local_948);
        std::__cxx11::string::operator=((string *)local_7a0,(string *)&local_928);
        std::__cxx11::string::~string((string *)&local_928);
        std::__cxx11::string::~string((string *)&local_948);
        std::allocator<char>::~allocator(&local_949);
      }
    }
    else {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,"ValgrindCommandOptions",&local_8b9);
      cmCTest::GetCTestConfiguration(&local_898,pcVar1,&local_8b8);
      std::__cxx11::string::operator=((string *)local_7a0,(string *)&local_898);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::allocator<char>::~allocator(&local_8b9);
    }
  }
  else {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"MemoryCheckCommandOptions",&local_829);
    cmCTest::GetCTestConfiguration(&local_808,pcVar1,&local_828);
    std::__cxx11::string::operator=((string *)local_7a0,(string *)&local_808);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
  }
  cmSystemTools::ParseArguments(&local_9f8,(string *)local_7a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->MemoryTesterOptions,&local_9f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9f8);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&local_a38,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  std::operator+(&local_a18,&local_a38,"/Testing/Temporary/MemoryChecker.??.log");
  std::__cxx11::string::operator=((string *)&this->MemoryTesterOutputFile,(string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  switch(this->MemoryTesterStyle) {
  case 1:
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->MemoryTesterOptions);
    if (bVar2) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [3])0x1193bd9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [16])"--tool=memcheck");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [17])"--leak-check=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[21]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [21])"--show-reachable=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [17])"--num-callers=50");
    }
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a78,"MemoryCheckSuppressionFile",&local_a79);
    cmCTest::GetCTestConfiguration(&local_a58,pcVar1,&local_a78);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_a58);
    std::__cxx11::string::~string((string *)&local_a78);
    std::allocator<char>::~allocator(&local_a79);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ac0,"MemoryCheckSuppressionFile",&local_ac1);
      cmCTest::GetCTestConfiguration(&local_aa0,pcVar1,&local_ac0);
      bVar2 = cmsys::SystemTools::FileExists(&local_aa0);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::__cxx11::string::~string((string *)&local_ac0);
      std::allocator<char>::~allocator(&local_ac1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c40);
        poVar10 = std::operator<<((ostream *)local_c40,
                                  "Cannot find memory checker suppression file: ");
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c80,"MemoryCheckSuppressionFile",&local_c81);
        cmCTest::GetCTestConfiguration(&local_c60,pcVar1,&local_c80);
        poVar10 = std::operator<<(poVar10,(string *)&local_c60);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_c60);
        std::__cxx11::string::~string((string *)&local_c80);
        std::allocator<char>::~allocator(&local_c81);
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::ostringstream::str();
        pcVar11 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,599,pcVar11,false);
        std::__cxx11::string::~string(local_ca8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c40);
        this_local._7_1_ = 0;
        local_cac = 1;
        goto LAB_00232297;
      }
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d10,"MemoryCheckSuppressionFile",&local_d11);
      cmCTest::GetCTestConfiguration(&local_cf0,pcVar1,&local_d10);
      std::operator+(&local_cd0,"--suppressions=",&local_cf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterOptions,&local_cd0);
      std::__cxx11::string::~string((string *)&local_cd0);
      std::__cxx11::string::~string((string *)&local_cf0);
      std::__cxx11::string::~string((string *)&local_d10);
      std::allocator<char>::~allocator(&local_d11);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tempDrMemoryDir.field_2 + 8),"--log-file=",&this->MemoryTesterOutputFile)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)((long)&tempDrMemoryDir.field_2 + 8)
               );
    std::__cxx11::string::~string((string *)(tempDrMemoryDir.field_2._M_local_buf + 8));
    break;
  case 2:
    std::__cxx11::string::string((string *)(dpbdFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)(dpbdFile.field_2._M_local_buf + 8),"-log-file=");
    std::__cxx11::string::operator+=
              ((string *)(dpbdFile.field_2._M_local_buf + 8),(string *)&this->MemoryTesterOutputFile
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)((long)&dpbdFile.field_2 + 8));
    local_cac = 4;
    std::__cxx11::string::~string((string *)(dpbdFile.field_2._M_local_buf + 8));
    break;
  case 3:
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)&logdirOption,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &logdirOption,"/Testing/Temporary/DrMemory");
    std::__cxx11::string::~string((string *)&logdirOption);
    bVar2 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[7],_0>
                      (&this->MemoryTesterOptions,(char (*) [7])0x110040c);
    if (!bVar2) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [7])0x110040c);
    }
    bVar2 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[7],_0>
                      (&this->MemoryTesterOptions,(char (*) [7])"-batch");
    if (!bVar2) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [7])"-batch");
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [8])"-logdir");
    iVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->MemoryTesterOptions);
    iVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->MemoryTesterOptions);
    local_d80 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[8]>
                          (iVar7._M_current,iVar8._M_current,(char (*) [8])"-logdir");
    drMemoryLogDir.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->MemoryTesterOptions);
    bVar2 = __gnu_cxx::operator==
                      (&local_d80,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&drMemoryLogDir.field_2 + 8));
    if (bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &logdirLocation,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d58,
                     "/??");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)&logdirLocation);
      std::__cxx11::string::operator=
                ((string *)&this->MemoryTesterOutputFile,(string *)&logdirLocation);
      std::__cxx11::string::~string((string *)&logdirLocation);
    }
    else {
      local_dc8 = local_d80._M_current;
      local_dc0 = std::
                  next<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_d80,1);
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_dc0);
      std::__cxx11::string::operator=((string *)&this->MemoryTesterOutputFile,(string *)pbVar9);
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_dc0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterDynamicOptions,pbVar9);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_dd0,&local_d80);
      local_de0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_dc0,1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_dd8,&local_de0);
      local_de8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::erase(&this->MemoryTesterOptions,local_dd0,local_dd8);
    }
    std::__cxx11::string::operator+=((string *)&this->MemoryTesterOutputFile,"/*/results.txt");
    iVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->MemoryTesterOptions);
    iVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->MemoryTesterOptions);
    local_df0 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[14]>
                          (iVar7._M_current,iVar8._M_current,(char (*) [14])"-symcache_dir");
    drMemoryCacheDir.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->MemoryTesterOptions);
    bVar2 = __gnu_cxx::operator==
                      (&local_df0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&drMemoryCacheDir.field_2 + 8));
    if (bVar2) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[14]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,(char (*) [14])"-symcache_dir");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d58,
                     "/cache");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)local_e28);
      std::__cxx11::string::~string((string *)local_e28);
    }
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e68,"MemoryCheckSuppressionFile",&local_e69);
    cmCTest::GetCTestConfiguration(&local_e48,pcVar1,&local_e68);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_e48);
    std::__cxx11::string::~string((string *)&local_e68);
    std::allocator<char>::~allocator(&local_e69);
    if (((bVar3 ^ 0xff) & 1) == 0) {
LAB_00231787:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [3])0x1179fa9);
      local_cac = 4;
    }
    else {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_eb0,"MemoryCheckSuppressionFile",&local_eb1);
      cmCTest::GetCTestConfiguration(&local_e90,pcVar1,&local_eb0);
      bVar2 = cmsys::SystemTools::FileExists(&local_e90);
      std::__cxx11::string::~string((string *)&local_e90);
      std::__cxx11::string::~string((string *)&local_eb0);
      std::allocator<char>::~allocator(&local_eb1);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[10]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->MemoryTesterOptions,(char (*) [10])"-suppress");
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10d8,"MemoryCheckSuppressionFile",
                   (allocator<char> *)(outputFile.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_10b8,pcVar1,&local_10d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->MemoryTesterOptions,&local_10b8);
        std::__cxx11::string::~string((string *)&local_10b8);
        std::__cxx11::string::~string((string *)&local_10d8);
        std::allocator<char>::~allocator((allocator<char> *)(outputFile.field_2._M_local_buf + 0xf))
        ;
        goto LAB_00231787;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1030);
      poVar10 = std::operator<<((ostream *)local_1030,
                                "Cannot find memory checker suppression file: ");
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1070,"MemoryCheckSuppressionFile",&local_1071);
      cmCTest::GetCTestConfiguration(&local_1050,pcVar1,&local_1070);
      poVar10 = std::operator<<(poVar10,(string *)&local_1050);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_1050);
      std::__cxx11::string::~string((string *)&local_1070);
      std::allocator<char>::~allocator(&local_1071);
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar11 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x290,pcVar11,false);
      std::__cxx11::string::~string(local_1098);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1030);
      this_local._7_1_ = 0;
      local_cac = 1;
    }
    std::__cxx11::string::~string((string *)local_d58);
    if (local_cac == 4) break;
    goto LAB_00232297;
  case 4:
    std::__cxx11::string::operator=
              ((string *)&this->BoundsCheckerXMLFile,(string *)&this->MemoryTesterOutputFile);
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)((long)&envVar.field_2 + 8),
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&envVar.field_2 + 8),"/Testing/Temporary/MemoryChecker.??.DPbd");
    std::__cxx11::string::~string((string *)(envVar.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&this->BoundsCheckerDPBDFile,(string *)local_1120);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"/B");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)local_1120);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"/X");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,&this->MemoryTesterOutputFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterOptions,(char (*) [3])"/M");
    local_cac = 4;
    std::__cxx11::string::~string((string *)local_1120);
    break;
  case 5:
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->MemoryTesterOptions);
    if (bVar2) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [7])"--tool");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [9])0x11034ff);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [13])"--leak-check");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [5])0x11be317);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [11])"--log-file");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,&this->MemoryTesterOutputFile);
    break;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [4])0x1112261);
    std::__cxx11::string::string((string *)(extraOptions.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(suppressionsOption.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_11a0);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11e0,"MemoryCheckSanitizerOptions",&local_11e1);
    cmCTest::GetCTestConfiguration(&local_11c0,pcVar1,&local_11e0);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_11c0);
    std::__cxx11::string::~string((string *)&local_11e0);
    std::allocator<char>::~allocator(&local_11e1);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1248,"MemoryCheckSanitizerOptions",&local_1249);
      cmCTest::GetCTestConfiguration(&local_1228,pcVar1,&local_1248);
      std::operator+(&local_1208,":",&local_1228);
      std::__cxx11::string::operator=
                ((string *)(suppressionsOption.field_2._M_local_buf + 8),(string *)&local_1208);
      std::__cxx11::string::~string((string *)&local_1208);
      std::__cxx11::string::~string((string *)&local_1228);
      std::__cxx11::string::~string((string *)&local_1248);
      std::allocator<char>::~allocator(&local_1249);
    }
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1290,"MemoryCheckSuppressionFile",&local_1291);
    cmCTest::GetCTestConfiguration(&local_1270,pcVar1,&local_1290);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_1270);
    std::__cxx11::string::~string((string *)&local_1290);
    std::allocator<char>::~allocator(&local_1291);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12f8,"MemoryCheckSuppressionFile",
                 (allocator<char> *)(outputFile_1.field_2._M_local_buf + 0xf));
      cmCTest::GetCTestConfiguration(&local_12d8,pcVar1,&local_12f8);
      std::operator+(&local_12b8,":suppressions=",&local_12d8);
      std::__cxx11::string::operator=((string *)local_11a0,(string *)&local_12b8);
      std::__cxx11::string::~string((string *)&local_12b8);
      std::__cxx11::string::~string((string *)&local_12d8);
      std::__cxx11::string::~string((string *)&local_12f8);
      std::allocator<char>::~allocator((allocator<char> *)(outputFile_1.field_2._M_local_buf + 0xf))
      ;
    }
    if (this->MemoryTesterStyle == 6) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"ASAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 7) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"LSAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 8) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"TSAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 9) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"MSAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 10) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"UBSAN_OPTIONS");
    }
    std::operator+(&local_1360,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&extraOptions.field_2 + 8),"=log_path=\'");
    std::operator+(&local_1340,&local_1360,&this->MemoryTesterOutputFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1320,
                   &local_1340,"\'");
    std::__cxx11::string::~string((string *)&local_1340);
    std::__cxx11::string::~string((string *)&local_1360);
    std::operator+(&local_13a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11a0);
    std::operator+(&local_1380,&local_13a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suppressionsOption.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_1380);
    std::__cxx11::string::~string((string *)&local_1380);
    std::__cxx11::string::~string((string *)&local_13a0);
    local_cac = 4;
    std::__cxx11::string::~string((string *)local_1320);
    std::__cxx11::string::~string((string *)local_11a0);
    std::__cxx11::string::~string((string *)(suppressionsOption.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(extraOptions.field_2._M_local_buf + 8));
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1518);
    poVar10 = std::operator<<((ostream *)local_1518,"Do not understand memory checker: ");
    poVar10 = std::operator<<(poVar10,(string *)&this->MemoryTester);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x305,pcVar11,false);
    std::__cxx11::string::~string(local_1538);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1518);
    this_local._7_1_ = 0;
    local_cac = 1;
    goto LAB_00232297;
  }
  InitializeResultsVectors(this);
  this_local._7_1_ = 1;
  local_cac = 1;
LAB_00232297:
  std::__cxx11::string::~string((string *)local_7a0);
LAB_002322b3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("drmemory") != std::string::npos ||
               this->CTest->GetCTestConfiguration("MemoryCheckType") ==
                 "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (testerName.find("cuda-memcheck") != std::string::npos ||
               testerName.find("compute-sanitizer") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("DrMemoryCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("DrMemoryCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("CudaSanitizerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (checkType == "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (checkType == "CudaSanitizer") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("DrMemoryCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("DrMemoryCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::DRMEMORY: {
      std::string tempDrMemoryDir =
        this->CTest->GetBinaryDir() + "/Testing/Temporary/DrMemory";

      if (!cm::contains(this->MemoryTesterOptions, "-quiet")) {
        this->MemoryTesterOptions.emplace_back("-quiet");
      }

      if (!cm::contains(this->MemoryTesterOptions, "-batch")) {
        this->MemoryTesterOptions.emplace_back("-batch");
      }

      this->MemoryTesterDynamicOptions.emplace_back("-logdir");
      auto logdirOption =
        std::find(this->MemoryTesterOptions.begin(),
                  this->MemoryTesterOptions.end(), "-logdir");
      if (logdirOption == this->MemoryTesterOptions.end()) {
        // No logdir found in memory tester options
        std::string drMemoryLogDir = tempDrMemoryDir + "/??";
        this->MemoryTesterDynamicOptions.push_back(drMemoryLogDir);
        this->MemoryTesterOutputFile = drMemoryLogDir;
      } else {
        // Use logdir found in memory tester options
        auto logdirLocation = std::next(logdirOption);
        this->MemoryTesterOutputFile = *logdirLocation;
        this->MemoryTesterDynamicOptions.push_back(*logdirLocation);
        this->MemoryTesterOptions.erase(logdirOption, logdirLocation + 1);
      }
      this->MemoryTesterOutputFile += "/*/results.txt";

      if (std::find(this->MemoryTesterOptions.begin(),
                    this->MemoryTesterOptions.end(),
                    "-symcache_dir") == this->MemoryTesterOptions.end()) {
        this->MemoryTesterDynamicOptions.emplace_back("-symcache_dir");
        std::string drMemoryCacheDir = tempDrMemoryDir + "/cache";
        this->MemoryTesterDynamicOptions.push_back(drMemoryCacheDir);
      }

      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.emplace_back("-suppress");
        this->MemoryTesterOptions.push_back(
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }

      this->MemoryTesterOptions.emplace_back("--");

      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    case cmCTestMemCheckHandler::CUDA_SANITIZER: {
      // cuda sanitizer separates flags from arguments by spaces
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("--tool");
        this->MemoryTesterOptions.emplace_back("memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check");
        this->MemoryTesterOptions.emplace_back("full");
      }
      this->MemoryTesterDynamicOptions.emplace_back("--log-file");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}